

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  void *pvVar1;
  Logger *info_log;
  Version *this_00;
  MemTable *this_01;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Iterator *iter;
  undefined4 extraout_var_00;
  Version *in_R8;
  long lVar6;
  Slice min_user_key;
  Slice max_user_key;
  FileMetaData meta;
  string local_d0;
  Version *local_b0;
  Version *local_a8;
  MemTable *local_a0;
  Slice local_98;
  FileMetaData local_88;
  
  local_a8 = in_R8;
  iVar4 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_88.smallest.rep_._M_dataplus._M_p = (pointer)&local_88.smallest.rep_.field_2;
  local_88.refs = 0;
  local_88.allowed_seeks = 0x40000000;
  local_88.file_size = 0;
  local_88.smallest.rep_._M_string_length = 0;
  local_88.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_88.largest.rep_._M_dataplus._M_p = (pointer)&local_88.largest.rep_.field_2;
  local_88.largest.rep_._M_string_length = 0;
  local_88.largest.rep_.field_2._M_local_buf[0] = '\0';
  pvVar1 = mem[4].arena_.memory_usage_.rep_;
  local_88.number = *(uint64_t *)((long)pvVar1 + 0x48);
  *(uint64_t *)((long)pvVar1 + 0x48) = local_88.number + 1;
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)(mem + 4),&local_88.number);
  local_b0 = base;
  local_a0 = mem + 4;
  iter = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",local_88.number);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  port::Mutex::Unlock((Mutex *)&mem[1].table_);
  BuildTable((leveldb *)&local_d0,(string *)&mem[1].arena_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (TableCache *)
             mem[1].arena_.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,iter,&local_88);
  Status::operator=((Status *)this,(Status *)&local_d0);
  Status::~Status((Status *)&local_d0);
  port::Mutex::Lock((Mutex *)&mem[1].table_);
  uVar3 = local_88.file_size;
  uVar2 = local_88.number;
  info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
  Status::ToString_abi_cxx11_(&local_d0,(Status *)this);
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar2,uVar3,local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  this_01 = local_a0;
  if (iter != (Iterator *)0x0) {
    (*iter->_vptr_Iterator[1])(iter);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
           *)this_01,&local_88.number);
  lVar6 = 0;
  if (((this->super_DB)._vptr_DB == (_func_int **)0x0) && (local_88.file_size != 0)) {
    local_d0._0_16_ = InternalKey::user_key(&local_88.smallest);
    local_98 = InternalKey::user_key(&local_88.largest);
    this_00 = local_b0;
    if (local_a8 == (Version *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = Version::PickLevelForMemTableOutput(local_a8,(Slice *)&local_d0,&local_98);
    }
    VersionEdit::AddFile
              ((VersionEdit *)this_00,iVar5,local_88.number,local_88.file_size,&local_88.smallest,
               &local_88.largest);
    lVar6 = (long)iVar5;
  }
  local_d0._M_string_length = 0;
  iVar5 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_d0._M_dataplus._M_p =
       (pointer)(CONCAT44(extraout_var_00,iVar5) - CONCAT44(extraout_var,iVar4));
  local_d0.field_2._M_allocated_capacity = local_88.file_size;
  CompactionStats::Add
            ((CompactionStats *)((long)&mem[4].table_.compare_ + lVar6 * 0x18 + 8),
             (CompactionStats *)&local_d0);
  FileMetaData::~FileMetaData(&local_88);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable *mem, VersionEdit *edit,
                                Version *base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator *iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long) meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long) meta.number,
      (unsigned long long) meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);


  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base!=NULL) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size,
                  meta.smallest, meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}